

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-escape.c
# Opt level: O1

_Bool borg_escape_stair(void)

{
  if ((borg_grids[borg.c.y][borg.c.x].feat == '\x05') && ((player->opts).opt[0x20] == false)) {
    borg_note("# Escaping level via stairs.");
    borg_keypress(0x3c);
    return true;
  }
  return false;
}

Assistant:

static bool borg_escape_stair(void)
{
    /* Current grid */
    borg_grid *ag = &borg_grids[borg.c.y][borg.c.x];

    /* Usable stairs */
    if (ag->feat == FEAT_LESS && !OPT(player, birth_force_descend)) {
        /* Take the stairs */
        borg_note("# Escaping level via stairs.");
        borg_keypress('<');

        /* Success */
        return true;
    }

    return false;
}